

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertNumbersArrayWithin
               (UNITY_UINT delta,void *expected,void *actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_DISPLAY_STYLE_T style,UNITY_FLAGS_T flags)

{
  int iVar1;
  ulong uVar2;
  UNITY_INT mask;
  UNITY_INT actual_val;
  UNITY_INT expect_val;
  UNITY_DISPLAY_STYLE_T local_40;
  uint increment;
  uint length;
  UNITY_UINT32 elements;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  UNITY_INT *pUStack_20;
  UNITY_UINT32 num_elements_local;
  void *actual_local;
  void *expected_local;
  UNITY_UINT delta_local;
  
  local_40 = style & 0xf;
  if ((Unity.CurrentTestFailed != 0) || (Unity.CurrentTestIgnored != 0)) {
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  if (num_elements == 0) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  if (expected != actual) {
    iVar1 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
    increment = num_elements;
    pUStack_20 = (UNITY_INT *)actual;
    actual_local = expected;
    if (iVar1 != 0) {
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    while (increment != 0) {
      increment = increment - 1;
      switch(local_40) {
      case 1:
        actual_val = (UNITY_INT)*actual_local;
        mask = (UNITY_INT)(char)*pUStack_20;
        expect_val._4_4_ = 1;
        break;
      case 2:
        actual_val = (UNITY_INT)*actual_local;
        mask = (UNITY_INT)(short)*pUStack_20;
        expect_val._4_4_ = 2;
        break;
      default:
      case 4:
        actual_val = (UNITY_INT)*actual_local;
        mask = (UNITY_INT)(int)*pUStack_20;
        expect_val._4_4_ = 4;
        local_40 = 4;
        break;
      case 8:
        actual_val = *actual_local;
        mask = *pUStack_20;
        expect_val._4_4_ = 8;
      }
      if ((style & 0x10) == 0x10) {
        if (actual_val < mask) {
          uVar2 = mask - actual_val;
        }
        else {
          uVar2 = actual_val - mask;
        }
      }
      else if ((ulong)actual_val < (ulong)mask) {
        uVar2 = mask - actual_val;
      }
      else {
        uVar2 = actual_val - mask;
      }
      Unity.CurrentTestFailed = (UNITY_UINT)(int)(uint)(delta < uVar2);
      if (Unity.CurrentTestFailed != 0) {
        if (((style & 0x20) != 0) && (local_40 < 4)) {
          uVar2 = (1L << ((byte)(local_40 << 3) & 0x3f)) - 1;
          actual_val = uVar2 & actual_val;
          mask = uVar2 & mask;
        }
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(" Values Not Within Delta ");
        UnityPrintNumberByStyle(delta,style);
        UnityPrint(" Element ");
        UnityPrintNumberUnsigned((ulong)((num_elements - increment) - 1));
        UnityPrint(" Expected ");
        UnityPrintNumberByStyle(actual_val,style);
        UnityPrint(" Was ");
        UnityPrintNumberByStyle(mask,style);
        UnityAddMsgIfSpecified(msg);
        Unity.CurrentTestFailed = 1;
        longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
      }
      if (flags == UNITY_ARRAY_TO_ARRAY) {
        actual_local = (void *)((long)actual_local + (ulong)expect_val._4_4_);
      }
      pUStack_20 = (UNITY_INT *)((long)pUStack_20 + (ulong)expect_val._4_4_);
    }
  }
  return;
}

Assistant:

void UnityAssertNumbersArrayWithin(const UNITY_UINT delta,
                                   UNITY_INTERNAL_PTR expected,
                                   UNITY_INTERNAL_PTR actual,
                                   const UNITY_UINT32 num_elements,
                                   const char* msg,
                                   const UNITY_LINE_TYPE lineNumber,
                                   const UNITY_DISPLAY_STYLE_T style,
                                   const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 elements = num_elements;
    unsigned int length   = style & 0xF;
    unsigned int increment = 0;

    RETURN_IF_FAIL_OR_IGNORE;

    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull(expected, actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    while ((elements > 0) && (elements--))
    {
        UNITY_INT expect_val;
        UNITY_INT actual_val;

        switch (length)
        {
            case 1:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT8*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT8*)actual;
                increment  = sizeof(UNITY_INT8);
                break;

            case 2:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT16*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT16*)actual;
                increment  = sizeof(UNITY_INT16);
                break;

#ifdef UNITY_SUPPORT_64
            case 8:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT64*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT64*)actual;
                increment  = sizeof(UNITY_INT64);
                break;
#endif

            default: /* default is length 4 bytes */
            case 4:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT32*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT32*)actual;
                increment  = sizeof(UNITY_INT32);
                length = 4;
                break;
        }

        if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
        {
            if (actual_val > expect_val)
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)actual_val - (UNITY_UINT)expect_val) > delta);
            }
            else
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)expect_val - (UNITY_UINT)actual_val) > delta);
            }
        }
        else
        {
            if ((UNITY_UINT)actual_val > (UNITY_UINT)expect_val)
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)actual_val - (UNITY_UINT)expect_val) > delta);
            }
            else
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)expect_val - (UNITY_UINT)actual_val) > delta);
            }
        }

        if (Unity.CurrentTestFailed)
        {
            if ((style & UNITY_DISPLAY_RANGE_UINT) && (length < (UNITY_INT_WIDTH / 8)))
            {   /* For UINT, remove sign extension (padding 1's) from signed type casts above */
                UNITY_INT mask = 1;
                mask = (mask << 8 * length) - 1;
                expect_val &= mask;
                actual_val &= mask;
            }
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(UnityStrDelta);
            UnityPrintNumberByStyle((UNITY_INT)delta, style);
            UnityPrint(UnityStrElement);
            UnityPrintNumberUnsigned(num_elements - elements - 1);
            UnityPrint(UnityStrExpected);
            UnityPrintNumberByStyle(expect_val, style);
            UnityPrint(UnityStrWas);
            UnityPrintNumberByStyle(actual_val, style);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
        /* Walk through array by incrementing the pointers */
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            expected = (UNITY_INTERNAL_PTR)((const char*)expected + increment);
        }
        actual = (UNITY_INTERNAL_PTR)((const char*)actual + increment);
    }
}